

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftcid.c
# Opt level: O0

FT_Error FT_Get_CID_Is_Internally_CID_Keyed(FT_Face face,FT_Bool *is_cid)

{
  FT_Driver pFVar1;
  FT_Module_Interface local_38;
  FT_Pointer _tmp_;
  FT_Module module;
  FT_Service_CID service;
  FT_Bool ic;
  FT_Bool *pFStack_18;
  FT_Error error;
  FT_Bool *is_cid_local;
  FT_Face face_local;
  
  service._4_4_ = 6;
  service._3_1_ = '\0';
  pFStack_18 = is_cid;
  if (face != (FT_Face)0x0) {
    pFVar1 = face->driver;
    local_38 = (FT_Module_Interface)0x0;
    is_cid_local = (FT_Bool *)face;
    if (((pFVar1->root).clazz)->get_interface != (FT_Module_Requester)0x0) {
      local_38 = (*((pFVar1->root).clazz)->get_interface)(&pFVar1->root,"CID");
    }
    if ((local_38 != (FT_Module_Interface)0x0) && (*(long *)((long)local_38 + 8) != 0)) {
      service._4_4_ = (**(code **)((long)local_38 + 8))(is_cid_local,(long)&service + 3);
    }
  }
  if (pFStack_18 != (FT_Bool *)0x0) {
    *pFStack_18 = service._3_1_;
  }
  return service._4_4_;
}

Assistant:

FT_EXPORT_DEF( FT_Error )
  FT_Get_CID_Is_Internally_CID_Keyed( FT_Face   face,
                                      FT_Bool  *is_cid )
  {
    FT_Error  error = FT_ERR( Invalid_Argument );
    FT_Bool   ic = 0;


    if ( face )
    {
      FT_Service_CID  service;


      FT_FACE_FIND_SERVICE( face, service, CID );

      if ( service && service->get_is_cid )
        error = service->get_is_cid( face, &ic);
    }

    if ( is_cid )
      *is_cid = ic;

    return error;
  }